

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O0

void __thiscall
kratos::CheckFlipFlopAlwaysFFVisitor::~CheckFlipFlopAlwaysFFVisitor
          (CheckFlipFlopAlwaysFFVisitor *this)

{
  CheckFlipFlopAlwaysFFVisitor *this_local;
  
  ~CheckFlipFlopAlwaysFFVisitor(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* gen) override {
        uint64_t stmt_count = gen->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = gen->get_stmt(i);
            if (stmt->type() == StatementType::Block) {
                auto block = stmt->as<StmtBlock>();
                if (block->block_type() == StatementBlockType::Sequential) {
                    check_always_ff(block->as<SequentialStmtBlock>().get());
                }
            }
        }
    }